

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonDom.cc
# Opt level: O3

Entity __thiscall avro::json::readEntity(json *this,JsonParser *p)

{
  bool bVar1;
  int64_t iVar2;
  pointer pcVar3;
  sp_counted_base *psVar4;
  undefined8 this_00;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,avro::json::Entity>,std::_Select1st<std::pair<std::__cxx11::string_const,avro::json::Entity>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,avro::json::Entity>>>
  *this_01;
  Token TVar5;
  undefined8 *puVar6;
  domain_error *this_02;
  placeholder *extraout_RDX;
  placeholder *extraout_RDX_00;
  placeholder *extraout_RDX_01;
  placeholder *extraout_RDX_02;
  placeholder *extraout_RDX_03;
  placeholder *extraout_RDX_04;
  uint *puVar7;
  shared_count *this_03;
  Entity EVar8;
  string k;
  shared_ptr<std::vector<avro::json::Entity,_std::allocator<avro::json::Entity>_>_> v;
  shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>_>
  v_1;
  Entity n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [40];
  any local_60;
  double local_58;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,avro::json::Entity>,std::_Select1st<std::pair<std::__cxx11::string_const,avro::json::Entity>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,avro::json::Entity>>>
  *local_50;
  shared_count local_48;
  Entity local_40;
  
  if (p->peeked == true) {
    TVar5 = p->curToken;
  }
  else {
    TVar5 = JsonParser::doAdvance(p);
    p->curToken = TVar5;
    p->peeked = true;
  }
  switch(TVar5) {
  case tkNull:
    p->peeked = false;
    puVar7 = &switchD_0015dce3::switchdataD_0016a95c;
    *(undefined4 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    goto LAB_0015e129;
  case tkBool:
    p->peeked = false;
    bVar1 = p->bv;
    *(undefined4 *)this = 1;
    puVar6 = (undefined8 *)operator_new(0x10);
    *puVar6 = &PTR__placeholder_001804f8;
    *(bool *)(puVar6 + 1) = bVar1;
    puVar7 = (uint *)extraout_RDX_01;
    break;
  case tkLong:
    p->peeked = false;
    iVar2 = p->lv;
    *(undefined4 *)this = 2;
    puVar6 = (undefined8 *)operator_new(0x10);
    *puVar6 = &PTR__placeholder_00180420;
    puVar6[1] = iVar2;
    puVar7 = (uint *)extraout_RDX_02;
    break;
  case tkDouble:
    p->peeked = false;
    local_58 = p->dv;
    *(undefined4 *)this = 3;
    puVar6 = (undefined8 *)operator_new(0x10);
    *puVar6 = &PTR__placeholder_001804b0;
    puVar6[1] = local_58;
    puVar7 = (uint *)extraout_RDX_03;
    break;
  case tkString:
    p->peeked = false;
    pcVar3 = (p->sv)._M_dataplus._M_p;
    local_88._0_8_ = local_88 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,pcVar3,pcVar3 + (p->sv)._M_string_length);
    boost::make_shared<std::__cxx11::string,std::__cxx11::string>
              ((boost *)&local_a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    *(undefined4 *)this = 4;
    puVar6 = (undefined8 *)operator_new(0x18);
    *puVar6 = &PTR__holder_00182140;
    puVar6[1] = local_a8._M_dataplus._M_p;
    puVar6[2] = local_a8._M_string_length;
    if ((long *)local_a8._M_string_length != (long *)0x0) {
      LOCK();
      *(int *)(local_a8._M_string_length + 8) = (int)*(long *)(local_a8._M_string_length + 8) + 1;
      UNLOCK();
    }
    *(undefined8 **)(this + 8) = puVar6;
    boost::detail::shared_count::~shared_count((shared_count *)&local_a8._M_string_length);
    puVar7 = (uint *)extraout_RDX;
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
      puVar7 = (uint *)extraout_RDX_00;
    }
    goto LAB_0015e129;
  case tkArrayStart:
    p->peeked = false;
    boost::make_shared<std::vector<avro::json::Entity,std::allocator<avro::json::Entity>>>();
LAB_0015de62:
    if (p->peeked == false) {
      TVar5 = JsonParser::doAdvance(p);
      p->curToken = TVar5;
      p->peeked = true;
      if (TVar5 == tkArrayEnd) goto LAB_0015e087;
    }
    else if (p->curToken == tkArrayEnd) goto LAB_0015e083;
    this_00 = local_88._0_8_;
    readEntity((json *)&local_a8,p);
    std::vector<avro::json::Entity,_std::allocator<avro::json::Entity>_>::
    emplace_back<avro::json::Entity>
              ((vector<avro::json::Entity,_std::allocator<avro::json::Entity>_> *)this_00,
               (Entity *)&local_a8);
    if ((long *)local_a8._M_string_length != (long *)0x0) {
      (**(code **)(*(long *)local_a8._M_string_length + 8))();
    }
    goto LAB_0015de62;
  default:
    this_02 = (domain_error *)__cxa_allocate_exception(0x10);
    if (p->peeked == true) {
      TVar5 = p->curToken;
    }
    else {
      TVar5 = JsonParser::doAdvance(p);
      p->curToken = TVar5;
      p->peeked = true;
    }
    std::domain_error::domain_error(this_02,*(char **)(JsonParser::tokenNames + (ulong)TVar5 * 8));
    __cxa_throw(this_02,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  case tkObjectStart:
    p->peeked = false;
    boost::
    make_shared<std::map<std::__cxx11::string,avro::json::Entity,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,avro::json::Entity>>>>
              ();
LAB_0015df99:
    bVar1 = p->peeked;
    if (bVar1 == false) {
      TVar5 = JsonParser::doAdvance(p);
      p->curToken = TVar5;
      p->peeked = true;
      if (TVar5 == tkObjectEnd) goto LAB_0015e092;
LAB_0015dfd8:
      p->peeked = false;
LAB_0015dfdd:
      pcVar3 = (p->sv)._M_dataplus._M_p;
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,pcVar3,pcVar3 + (p->sv)._M_string_length);
      readEntity((json *)&local_40,p);
      this_01 = local_50;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_avro::json::Entity_&,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>
                  *)local_88,&local_a8,&local_40);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,avro::json::Entity>,std::_Select1st<std::pair<std::__cxx11::string_const,avro::json::Entity>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,avro::json::Entity>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,avro::json::Entity>>
                (this_01,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>
                          *)local_88);
      if (local_60.content != (placeholder *)0x0) {
        (*(local_60.content)->_vptr_placeholder[1])();
      }
      if ((vector<avro::json::Entity,_std::allocator<avro::json::Entity>_> *)local_88._0_8_ !=
          (vector<avro::json::Entity,_std::allocator<avro::json::Entity>_> *)(local_88 + 0x10)) {
        operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
      }
      if (local_40.value_.content != (placeholder *)0x0) {
        (*(local_40.value_.content)->_vptr_placeholder[1])();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0015df99;
    }
    if (p->curToken != tkObjectEnd) {
      if (bVar1 != false) goto LAB_0015dfd8;
      TVar5 = JsonParser::doAdvance(p);
      p->curToken = TVar5;
      goto LAB_0015dfdd;
    }
    if (bVar1 == false) {
      TVar5 = JsonParser::doAdvance(p);
      p->curToken = TVar5;
      goto LAB_0015e0db;
    }
LAB_0015e092:
    p->peeked = false;
LAB_0015e0db:
    *(undefined4 *)this = 6;
    puVar6 = (undefined8 *)operator_new(0x18);
    *puVar6 = &PTR__holder_001821f0;
    this_03 = &local_48;
    goto LAB_0015e103;
  }
  *(undefined8 **)(this + 8) = puVar6;
LAB_0015e129:
  EVar8.value_.content = (placeholder *)puVar7;
  EVar8._0_8_ = this;
  return EVar8;
LAB_0015e083:
  if (p->peeked == false) {
    TVar5 = JsonParser::doAdvance(p);
    p->curToken = TVar5;
  }
  else {
LAB_0015e087:
    p->peeked = false;
  }
  *(undefined4 *)this = 5;
  puVar6 = (undefined8 *)operator_new(0x18);
  *puVar6 = &PTR__holder_00182198;
  this_03 = (shared_count *)(local_88 + 8);
LAB_0015e103:
  puVar6[1] = this_03[-1].pi_;
  psVar4 = this_03->pi_;
  puVar6[2] = psVar4;
  if (psVar4 != (sp_counted_base *)0x0) {
    LOCK();
    psVar4->use_count_ = psVar4->use_count_ + 1;
    UNLOCK();
  }
  *(undefined8 **)(this + 8) = puVar6;
  boost::detail::shared_count::~shared_count(this_03);
  puVar7 = (uint *)extraout_RDX_04;
  goto LAB_0015e129;
}

Assistant:

Entity readEntity(JsonParser& p)
{
    switch (p.peek()) {
    case JsonParser::tkNull:
        p.advance();
        return Entity();
    case JsonParser::tkBool:
        p.advance();
        return Entity(p.boolValue());
    case JsonParser::tkLong:
        p.advance();
        return Entity(p.longValue());
    case JsonParser::tkDouble:
        p.advance();
        return Entity(p.doubleValue());
    case JsonParser::tkString:
        p.advance();
        return Entity(boost::make_shared<String>(p.stringValue()));
    case JsonParser::tkArrayStart:
        {
            p.advance();
            boost::shared_ptr<Array> v = boost::make_shared<Array>();
            while (p.peek() != JsonParser::tkArrayEnd) {
                v->push_back(readEntity(p));
            }
            p.advance();
            return Entity(v);
        }
    case JsonParser::tkObjectStart:
        {
            p.advance();
            boost::shared_ptr<Object> v = boost::make_shared<Object>();
            while (p.peek() != JsonParser::tkObjectEnd) {
                p.advance();
                std::string k = p.stringValue();
                Entity n = readEntity(p);
                v->insert(std::make_pair(k, n));
            }
            p.advance();
            return Entity(v);
        }
    default:
        throw std::domain_error(JsonParser::toString(p.peek()));
    }
    
}